

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint inflateNoCompression
               (ucvector *out,LodePNGBitReader *reader,LodePNGDecompressSettings *settings)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long in_RDX;
  long *in_RSI;
  long *in_RDI;
  uint error;
  uint NLEN;
  uint LEN;
  size_t size;
  size_t bytepos;
  uint in_stack_ffffffffffffffc0;
  uint local_4;
  
  uVar1 = in_RSI[1];
  local_4 = 0;
  uVar5 = in_RSI[3] + 7U >> 3;
  if (uVar5 + 4 < uVar1) {
    uVar2 = (uint)*(byte *)(*in_RSI + uVar5) + (uint)*(byte *)(*in_RSI + 1 + uVar5) * 0x100;
    iVar3 = (uint)*(byte *)(*in_RSI + uVar5 + 2) + (uint)*(byte *)(*in_RSI + 1 + uVar5 + 2) * 0x100;
    lVar6 = uVar5 + 4;
    if ((*(int *)(in_RDX + 4) == 0) && (uVar2 + iVar3 != 0xffff)) {
      local_4 = 0x15;
    }
    else {
      uVar4 = ucvector_resize((ucvector *)CONCAT44(uVar2,iVar3),(ulong)in_stack_ffffffffffffffc0);
      if (uVar4 == 0) {
        local_4 = 0x53;
      }
      else if (uVar1 < lVar6 + (ulong)uVar2) {
        local_4 = 0x17;
      }
      else {
        lodepng_memcpy((void *)((*in_RDI + in_RDI[1]) - (ulong)uVar2),(void *)(*in_RSI + lVar6),
                       (ulong)uVar2);
        in_RSI[3] = ((ulong)uVar2 + lVar6) * 8;
      }
    }
  }
  else {
    local_4 = 0x34;
  }
  return local_4;
}

Assistant:

static unsigned inflateNoCompression(ucvector* out, LodePNGBitReader* reader,
                                     const LodePNGDecompressSettings* settings) {
  size_t bytepos;
  size_t size = reader->size;
  unsigned LEN, NLEN, error = 0;

  /*go to first boundary of byte*/
  bytepos = (reader->bp + 7u) >> 3u;

  /*read LEN (2 bytes) and NLEN (2 bytes)*/
  if(bytepos + 4 >= size) return 52; /*error, bit pointer will jump past memory*/
  LEN = (unsigned)reader->data[bytepos] + ((unsigned)reader->data[bytepos + 1] << 8u); bytepos += 2;
  NLEN = (unsigned)reader->data[bytepos] + ((unsigned)reader->data[bytepos + 1] << 8u); bytepos += 2;

  /*check if 16-bit NLEN is really the one's complement of LEN*/
  if(!settings->ignore_nlen && LEN + NLEN != 65535) {
    return 21; /*error: NLEN is not one's complement of LEN*/
  }

  if(!ucvector_resize(out, out->size + LEN)) return 83; /*alloc fail*/

  /*read the literal data: LEN bytes are now stored in the out buffer*/
  if(bytepos + LEN > size) return 23; /*error: reading outside of in buffer*/

  lodepng_memcpy(out->data + out->size - LEN, reader->data + bytepos, LEN);
  bytepos += LEN;

  reader->bp = bytepos << 3u;

  return error;
}